

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

bool ptc::Print<char>::is_escape<char[22]>(char (*str) [22],ANSI *flag)

{
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  
  if (*flag == generic) {
    sVar1 = strlen(*str);
    if (sVar1 == 0) {
      return false;
    }
    pvVar2 = memchr(str,0x1b,sVar1);
    bVar3 = pvVar2 != (void *)0x0;
    bVar4 = (long)pvVar2 - (long)str != -1;
  }
  else {
    if (*flag != first) {
      return false;
    }
    sVar1 = strlen(*str);
    bVar3 = sVar1 < 7;
    bVar4 = (*str)[0] == '\x1b';
  }
  return (bool)(bVar4 & bVar3);
}

Assistant:

static constexpr bool is_escape( const T& str, const ANSI& flag )
     {
      if constexpr( std::is_convertible_v <T, std::basic_string_view<T_str>> && ! std::is_same_v<T, std::nullptr_t> )
       {
        switch( flag )
         {
          case( ANSI::first ): 
           {
            return ( std::basic_string_view<T_str>( str ).length() < 7 ) && ( str[0] == '\033' );
           }
          case( ANSI::generic ):
           {
            return ( std::basic_string_view<T_str>( str ).find( '\033' ) != std::basic_string_view<T_str>::npos );
           }
         }
       }
      return false;
     }